

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Company *company)

{
  Boss *boss;
  long lVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Company *pCVar3;
  __type _Var4;
  string *psVar5;
  ostream *poVar6;
  Employee *pEVar7;
  Employee *pEVar8;
  undefined8 uStack_1d0;
  undefined1 auStack_1c8 [32];
  Employee *local_1a8;
  ostream *local_1a0;
  ostream *local_198;
  ostream *local_190;
  ostream *local_188;
  ostream *local_180;
  ostream *local_178;
  ostream *local_170;
  ostream *local_168;
  ostream *local_160;
  bool local_151;
  string *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  bool local_139;
  string *local_138;
  string *local_130;
  byte local_121;
  string *local_120;
  string *local_118;
  Employee *local_110;
  Employee *local_108;
  Employee *local_100;
  ulong local_f8;
  Employee *local_f0;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [4];
  int i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  uint local_a0;
  int local_9c;
  int j_1;
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [36];
  uint local_54;
  int local_50;
  int j;
  int i_1;
  int local_3c;
  ulong uStack_38;
  int i;
  unsigned_long __vla_expr0;
  uint local_24;
  Company *pCStack_20;
  int n;
  Company *company_local;
  ostream *os_local;
  
  uStack_1d0 = 0x105db0;
  pCStack_20 = company;
  company_local = (Company *)os;
  local_24 = Boss::getNumberOfEmployees(company->boss);
  local_f8 = (ulong)local_24;
  lVar1 = -(local_f8 * 0xb8 + 0xf & 0xfffffffffffffff0);
  local_f0 = (Employee *)(auStack_1c8 + lVar1);
  uStack_38 = local_f8;
  __vla_expr0 = (unsigned_long)auStack_1c8;
  if (local_f8 != 0) {
    local_108 = local_f0 + local_f8;
    local_100 = local_f0;
    __vla_expr0 = (unsigned_long)auStack_1c8;
    do {
      pEVar8 = local_100;
      local_110 = local_100;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105e29;
      Employee::Employee(pEVar8);
      local_100 = local_110 + 1;
    } while (local_100 != local_108);
  }
  for (local_3c = 0; local_3c < (int)local_24; local_3c = local_3c + 1) {
    pEVar8 = pCStack_20->employees[local_3c];
    pEVar7 = local_f0 + local_3c;
    *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105e7e;
    Employee::operator=(pEVar7,pEVar8);
  }
  for (local_50 = 0; uVar2 = local_24, local_50 < (int)(local_24 - 1); local_50 = local_50 + 1) {
    while (local_54 = uVar2 - 1, local_50 < (int)local_54) {
      pEVar8 = local_f0 + (int)local_54;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105ee5;
      psVar5 = Person::getId_abi_cxx11_(&pEVar8->super_Person);
      local_118 = psVar5;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f07;
      std::__cxx11::string::substr((ulong)local_78,(ulong)psVar5);
      pEVar8 = local_f0 + (int)(local_54 - 1);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f26;
      psVar5 = Person::getId_abi_cxx11_(&pEVar8->super_Person);
      local_120 = psVar5;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f4b;
      std::__cxx11::string::substr((ulong)&j_1,(ulong)psVar5);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f5d;
      local_121 = std::operator<(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&j_1);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f6f;
      std::__cxx11::string::~string((string *)&j_1);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105f78;
      std::__cxx11::string::~string((string *)local_78);
      uVar2 = local_54;
      if ((local_121 & 1) != 0) {
        pEVar7 = local_f0 + (int)local_54;
        pEVar8 = local_f0 + (int)(local_54 - 1);
        *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x105fb1;
        std::swap<Employee>(pEVar7,pEVar8);
        uVar2 = local_54;
      }
    }
  }
  for (local_9c = 0; pCVar3 = company_local, uVar2 = local_24, local_9c < (int)(local_24 - 1);
      local_9c = local_9c + 1) {
    while (local_a0 = uVar2 - 1, local_9c < (int)local_a0) {
      pEVar8 = local_f0 + (int)local_a0;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106048;
      psVar5 = Person::getId_abi_cxx11_(&pEVar8->super_Person);
      local_130 = psVar5;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10606d;
      std::__cxx11::string::substr((ulong)local_c0,(ulong)psVar5);
      pEVar8 = local_f0 + (int)(local_a0 - 1);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10608f;
      psVar5 = Person::getId_abi_cxx11_(&pEVar8->super_Person);
      local_138 = psVar5;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1060b4;
      std::__cxx11::string::substr((ulong)local_e0,(ulong)psVar5);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1060c9;
      _Var4 = std::operator==(local_c0,local_e0);
      local_139 = false;
      if (_Var4) {
        pEVar8 = local_f0 + (int)local_a0;
        *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1060f7;
        local_148 = Person::getName_abi_cxx11_(&pEVar8->super_Person);
        pEVar8 = local_f0 + (int)(local_a0 - 1);
        *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106120;
        psVar5 = Person::getName_abi_cxx11_(&pEVar8->super_Person);
        __lhs = local_148;
        local_150 = psVar5;
        *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10613c;
        local_139 = std::operator<(__lhs,psVar5);
      }
      local_151 = local_139;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10615a;
      std::__cxx11::string::~string((string *)local_e0);
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106166;
      std::__cxx11::string::~string((string *)local_c0);
      uVar2 = local_a0;
      if ((local_151 & 1U) != 0) {
        pEVar7 = local_f0 + (int)local_a0;
        pEVar8 = local_f0 + (int)(local_a0 - 1);
        *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1061a2;
        std::swap<Employee>(pEVar7,pEVar8);
        uVar2 = local_a0;
      }
    }
  }
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106219;
  poVar6 = std::operator<<((ostream *)pCVar3,"Boss : ");
  local_160 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106235;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  boss = pCStack_20->boss;
  local_168 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106252;
  poVar6 = operator<<(poVar6,boss);
  local_170 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10626e;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_178 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10628a;
  poVar6 = std::operator<<(poVar6,"-------------------------------------\n");
  local_180 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1062a6;
  poVar6 = std::operator<<(poVar6,"Employees :");
  local_188 = poVar6;
  *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1062c2;
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_e4 = 0; pCVar3 = company_local, local_e4 < (int)local_24; local_e4 = local_e4 + 1) {
    pEVar8 = local_f0 + local_e4;
    *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1062fe;
    poVar6 = operator<<((ostream *)pCVar3,pEVar8);
    local_190 = poVar6;
    *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x10631a;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_198 = poVar6;
    *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106336;
    poVar6 = std::operator<<(poVar6,
                             "----------------------------------------------------------------------"
                            );
    local_1a0 = poVar6;
    *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x106352;
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  os_local = (ostream *)company_local;
  local_1a8 = local_f0 + local_f8;
  if (local_f0 != local_1a8) {
    do {
      pEVar8 = local_1a8 + -1;
      auStack_1c8._24_8_ = pEVar8;
      *(undefined8 *)(auStack_1c8 + lVar1 + -8) = 0x1063b3;
      Employee::~Employee(pEVar8);
      local_1a8 = (Employee *)auStack_1c8._24_8_;
    } while ((Employee *)auStack_1c8._24_8_ != local_f0);
  }
  return os_local;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    // copy the value of employees to another array to avoid changes in the original array
    int n = company.boss->getNumberOfEmployees();
    Employee newEmployees[n];
    for (int i = 0; i < n; ++i) {
        newEmployees[i] = *company.employees[i];
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the id's first two chars
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) < newEmployees[j - 1].getId().substr(0, 2))
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    for (int i = 0; i < n - 1; ++i) { // use bubble sort to sort based on the name
        for (int j = n - 1; j > i; --j) {
            if (newEmployees[j].getId().substr(0, 2) == newEmployees[j - 1].getId().substr(0, 2) &&
                newEmployees[j].getName() < newEmployees[j - 1].getName())
                swap(newEmployees[j], newEmployees[j - 1]);
        }
    }
    os << "Boss : " << endl << *company.boss << endl << "-------------------------------------\n" << "Employees :"
       << endl;
    for (int i = 0; i < n; ++i) {
        os << newEmployees[i] << endl << "----------------------------------------------------------------------"
           << endl;
    }
    return os;
}